

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::BufferTestUtil::VertexArrayVerifier::VertexArrayVerifier
          (VertexArrayVerifier *this,RenderContext *renderCtx,TestLog *log)

{
  RenderContext *renderCtx_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  ShaderProgram *pSVar5;
  char *pcVar6;
  TestError *this_00;
  undefined4 extraout_var;
  Functions *gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  ProgramSources local_110;
  ApiType local_3c;
  GLSLVersion local_38;
  GLSLVersion glslVersion;
  ApiType local_24;
  TestLog *pTStack_20;
  ContextType ctxType;
  TestLog *log_local;
  RenderContext *renderCtx_local;
  VertexArrayVerifier *this_local;
  long lVar7;
  
  pTStack_20 = log;
  BufferVerifierBase::BufferVerifierBase(&this->super_BufferVerifierBase,renderCtx,log);
  (this->super_BufferVerifierBase)._vptr_BufferVerifierBase =
       (_func_int **)&PTR__VertexArrayVerifier_015cb6f0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_posLoc = 0;
  this->m_byteVecLoc = 0;
  this->m_vao = 0;
  local_3c.m_bits = (*renderCtx->_vptr_RenderContext[2])();
  local_24.m_bits = local_3c.m_bits;
  bVar2 = glu::isContextTypeES((ContextType)local_3c.m_bits);
  local_38 = GLSL_VERSION_330;
  if (bVar2) {
    local_38 = GLSL_VERSION_300_ES;
  }
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  gl._6_1_ = 1;
  renderCtx_00 = (this->super_BufferVerifierBase).m_renderCtx;
  pcVar6 = glu::getGLSLVersionDeclaration(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,pcVar6,&local_151);
  std::operator+(&local_130,&local_150,
                 "\nin highp vec2 a_position;\nin mediump vec3 a_byteVec;\nout mediump vec3 v_byteVec;\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_byteVec = a_byteVec;\n}\n"
                );
  pcVar6 = glu::getGLSLVersionDeclaration(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,pcVar6,(allocator<char> *)((long)&gl + 7));
  std::operator+(&local_178,&local_198,
                 "\nin mediump vec3 v_byteVec;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(v_byteVec, 1.0);\n}\n"
                );
  glu::makeVtxFragSources(&local_110,&local_130,&local_178);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx_00,&local_110);
  gl._6_1_ = 0;
  this->m_program = pSVar5;
  glu::ProgramSources::~ProgramSources(&local_110);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar2) {
    glu::operator<<((this->super_BufferVerifierBase).m_log,this->m_program);
    pSVar5 = this->m_program;
    if (pSVar5 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar5);
      operator_delete(pSVar5,0xd0);
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
               ,0x1c4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  iVar3 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  pcVar1 = *(code **)(lVar7 + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  dVar4 = (*pcVar1)(dVar4,"a_position");
  this->m_posLoc = dVar4;
  pcVar1 = *(code **)(lVar7 + 0x780);
  dVar4 = glu::ShaderProgram::getProgram(this->m_program);
  dVar4 = (*pcVar1)(dVar4,"a_byteVec");
  this->m_byteVecLoc = dVar4;
  (**(code **)(lVar7 + 0x708))(1,&this->m_vao);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_positionBuf);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_indexBuf);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"Initialization failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                  ,0x1ce);
  return;
}

Assistant:

VertexArrayVerifier::VertexArrayVerifier (glu::RenderContext& renderCtx, tcu::TestLog& log)
	: BufferVerifierBase	(renderCtx, log)
	, m_program				(DE_NULL)
	, m_posLoc				(0)
	, m_byteVecLoc			(0)
	, m_vao					(0)
{
	const glu::ContextType	ctxType		= renderCtx.getType();
	const glu::GLSLVersion	glslVersion	= glu::isContextTypeES(ctxType) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;

	DE_ASSERT(glu::isGLSLVersionSupported(ctxType, glslVersion));

	m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(
		string(glu::getGLSLVersionDeclaration(glslVersion)) + "\n"
		"in highp vec2 a_position;\n"
		"in mediump vec3 a_byteVec;\n"
		"out mediump vec3 v_byteVec;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_byteVec = a_byteVec;\n"
		"}\n",

		string(glu::getGLSLVersionDeclaration(glslVersion)) + "\n"
		"in mediump vec3 v_byteVec;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = vec4(v_byteVec, 1.0);\n"
		"}\n"));

	if (!m_program->isOk())
	{
		m_log << *m_program;
		delete m_program;
		TCU_FAIL("Compile failed");
	}

	const glw::Functions& gl = m_renderCtx.getFunctions();
	m_posLoc		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	m_byteVecLoc	= gl.getAttribLocation(m_program->getProgram(), "a_byteVec");

	gl.genVertexArrays(1, &m_vao);
	gl.genBuffers(1, &m_positionBuf);
	gl.genBuffers(1, &m_indexBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Initialization failed");
}